

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

void __thiscall
adios2::core::Engine::DoPutSync
          (Engine *this,Variable<std::complex<double>_> *param_2,complex<double> *param_3)

{
  string *in_stack_000000a8;
  Engine *in_stack_000000b0;
  allocator local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"DoPutSync",&local_39);
  ThrowUp(in_stack_000000b0,in_stack_000000a8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void Engine::DoPutStructSync(VariableStruct &, const void *) { ThrowUp("DoPutStructSync"); }